

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer_info.cpp
# Opt level: O0

void __thiscall libtorrent::peer_info::peer_info(peer_info *this)

{
  peer_info *this_local;
  
  std::__cxx11::string::string((string *)this);
  typed_bitfield<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>::
  typed_bitfield(&this->pieces);
  libtorrent::flags::bitfield_flag<unsigned_int,_libtorrent::peer_flags_tag,_void>::bitfield_flag
            (&this->flags);
  libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::peer_source_flags_tag,_void>::
  bitfield_flag(&this->source);
  digest32<160L>::digest32(&this->pid);
  boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::basic_endpoint(&this->ip);
  boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::basic_endpoint(&this->local_endpoint);
  libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::bandwidth_state_flags_tag,_void>::
  bitfield_flag(&this->read_state);
  libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::bandwidth_state_flags_tag,_void>::
  bitfield_flag(&this->write_state);
  return;
}

Assistant:

peer_info::peer_info() = default;